

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O0

QHostInfo __thiscall QHostInfoCache::get(QHostInfoCache *this,QString *name,bool *valid)

{
  long lVar1;
  QHostInfoCacheElement *pQVar2;
  long lVar3;
  undefined1 *in_RCX;
  QHostInfo *in_RSI;
  QHostInfoPrivate *in_RDI;
  long in_FS_OFFSET;
  QHostInfoCacheElement *element;
  QMutexLocker<QMutex> locker;
  QString *in_stack_ffffffffffffff98;
  QHostInfoPrivate *other;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  other = in_RDI;
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)in_RDI,(QMutex *)in_stack_ffffffffffffff98);
  *in_RCX = 0;
  pQVar2 = QCache<QString,_QHostInfoCache::QHostInfoCacheElement>::object
                     ((QCache<QString,_QHostInfoCache::QHostInfoCacheElement> *)in_RDI,
                      in_stack_ffffffffffffff98);
  if (pQVar2 == (QHostInfoCacheElement *)0x0) {
    QHostInfo::QHostInfo(in_RSI,(int)((ulong)other >> 0x20));
  }
  else {
    lVar3 = QElapsedTimer::elapsed();
    if (lVar3 < *(int *)&in_RSI->d_ptr * 1000) {
      *in_RCX = 1;
    }
    QHostInfo::QHostInfo(in_RSI,(QHostInfo *)other);
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QHostInfo)other;
  }
  __stack_chk_fail();
}

Assistant:

QHostInfo QHostInfoCache::get(const QString &name, bool *valid)
{
    QMutexLocker locker(&this->mutex);

    *valid = false;
    if (QHostInfoCacheElement *element = cache.object(name)) {
        if (element->age.elapsed() < max_age*1000)
            *valid = true;
        return element->info;

        // FIXME idea:
        // if too old but not expired, trigger a new lookup
        // to freshen our cache
    }

    return QHostInfo();
}